

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantsTests.cpp
# Opt level: O3

void __thiscall ConstantsTest_Values_Test<double>::TestBody(ConstantsTest_Values_Test<double> *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  AssertionResult local_20;
  
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_400921fb5443d6f4;
  local_28.data_ = (AssertHelperData *)&DAT_400921fb5443d6f4;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_20,"static_cast<TypeParam>(constants::pi)",
             "Constants<TypeParam>::pi()",(double *)&local_30,(double *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x13,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_30.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_421beb9bf3a00000;
  local_28.data_ = (AssertHelperData *)&DAT_421beb9bf3a00000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_20,"static_cast<TypeParam>(constants::c)",
             "Constants<TypeParam>::c()",(double *)&local_30,(double *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x14,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_30.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_421beb9bf3a00000;
  local_28.data_ = (AssertHelperData *)&DAT_421beb9bf3a00000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_20,"static_cast<TypeParam>(constants::lightVelocity)",
             "Constants<TypeParam>::lightVelocity()",(double *)&local_30,(double *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x15,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_30.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_be0080f172b1f37d;
  local_28.data_ = (AssertHelperData *)&DAT_be0080f172b1f37d;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_20,"static_cast<TypeParam>(constants::electronCharge)",
             "Constants<TypeParam>::electronCharge()",(double *)&local_30,(double *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_30.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3a520b016873bbd3;
  local_28.data_ = (AssertHelperData *)&DAT_3a520b016873bbd3;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_20,"static_cast<TypeParam>(constants::electronMass)",
             "Constants<TypeParam>::electronMass()",(double *)&local_30,(double *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_30.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b002d36c08bec5d
  ;
  local_28.data_ = (AssertHelperData *)0x3b002d36c08bec5d;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_20,"static_cast<TypeParam>(constants::protonMass)",
             "Constants<TypeParam>::protonMass()",(double *)&local_30,(double *)&local_28);
  bVar1 = local_20.success_;
  if (local_20.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x18,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::Message::~Message((Message *)&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 == false) {
    return;
  }
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a54e3504ec0acb9
  ;
  local_28.data_ = (AssertHelperData *)0x3a54e3504ec0acb9;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_20,"static_cast<TypeParam>(constants::planck)",
             "Constants<TypeParam>::planck()",(double *)&local_30,(double *)&local_28);
  if (local_20.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (local_20.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
               ,0x19,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
  }
  else {
    testing::AssertionResult::~AssertionResult(&local_20);
    local_30.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3d7c2f8fd0fd919b;
    local_28.data_ = (AssertHelperData *)0x3d7c2f8fd0fd919b;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_20,"static_cast<TypeParam>(constants::eV)",
               "Constants<TypeParam>::eV()",(double *)&local_30,(double *)&local_28);
    if (local_20.success_ == false) {
      testing::Message::Message((Message *)&local_30);
      if (local_20.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                 ,0x1a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    }
    else {
      testing::AssertionResult::~AssertionResult(&local_20);
      local_30.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0x3ebae14bc36b1270;
      local_28.data_ = (AssertHelperData *)0x3ebae14bc36b1270;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_20,"static_cast<TypeParam>(constants::meV)",
                 "Constants<TypeParam>::meV()",(double *)&local_30,(double *)&local_28);
      if (local_20.success_ != false) goto LAB_0017884c;
      testing::Message::Message((Message *)&local_30);
      if (local_20.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_20.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/ConstantsTests.cpp"
                 ,0x1b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  testing::Message::~Message((Message *)&local_30);
LAB_0017884c:
  testing::AssertionResult::~AssertionResult(&local_20);
  return;
}

Assistant:

TYPED_TEST(ConstantsTest, Values)
{
    // Check that all members of Constants<T> can be instantiated for all T in types
    // and are the same as casted corresponding values of constants namespace
    ASSERT_EQ(static_cast<TypeParam>(constants::pi), Constants<TypeParam>::pi());
    ASSERT_EQ(static_cast<TypeParam>(constants::c), Constants<TypeParam>::c());
    ASSERT_EQ(static_cast<TypeParam>(constants::lightVelocity), Constants<TypeParam>::lightVelocity());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronCharge), Constants<TypeParam>::electronCharge());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronMass), Constants<TypeParam>::electronMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::protonMass), Constants<TypeParam>::protonMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::planck), Constants<TypeParam>::planck());
    ASSERT_EQ(static_cast<TypeParam>(constants::eV), Constants<TypeParam>::eV());
    ASSERT_EQ(static_cast<TypeParam>(constants::meV), Constants<TypeParam>::meV());
}